

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpec::TagPattern::TagPattern(TagPattern *this,string *tag,string *filterString)

{
  string *filterString_local;
  string *tag_local;
  TagPattern *this_local;
  
  Pattern::Pattern(&this->super_Pattern,filterString);
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__TagPattern_0029d508;
  toLower(&this->m_tag,tag);
  return;
}

Assistant:

TestSpec::TagPattern::TagPattern( std::string const& tag, std::string const& filterString )
    : Pattern( filterString )
    , m_tag( toLower( tag ) )
    {}